

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O2

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  int _w;
  ulong uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  long lVar11;
  undefined4 *puVar12;
  int local_d8;
  Mat m;
  Mat local_70;
  
  iVar1 = bottom_blob->c;
  iVar4 = this->stride;
  _w = bottom_blob->w / iVar4;
  uVar10 = (long)bottom_blob->h / (long)iVar4;
  iVar2 = (int)uVar10;
  Mat::create(top_blob,_w,iVar2,iVar4 * iVar1 * iVar4,bottom_blob->elemsize,opt->blob_allocator);
  local_d8 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (_w < 1) {
      _w = 0;
    }
    uVar10 = uVar10 & 0xffffffff;
    if (iVar2 < 1) {
      uVar10 = 0;
    }
    local_d8 = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (iVar4 = 0; iVar4 != iVar1; iVar4 = iVar4 + 1) {
      Mat::channel(&m,bottom_blob,iVar4);
      uVar3 = (ulong)(uint)this->stride;
      for (lVar7 = 0; lVar7 < (int)uVar3; lVar7 = lVar7 + 1) {
        lVar11 = 0;
        lVar6 = 0;
        while( true ) {
          iVar2 = (int)uVar3;
          if (iVar2 <= lVar6) break;
          Mat::channel(&local_70,top_blob,(int)lVar6 + (iVar2 * iVar4 + (int)lVar7) * iVar2);
          puVar12 = (undefined4 *)local_70.data;
          Mat::~Mat(&local_70);
          uVar3 = (ulong)this->stride;
          puVar5 = (undefined4 *)((long)m.w * m.elemsize * lVar7 + lVar11 + (long)m.data);
          for (uVar8 = 0; puVar9 = puVar5, iVar2 = _w, uVar8 != uVar10; uVar8 = uVar8 + 1) {
            while (iVar2 != 0) {
              *puVar12 = *puVar9;
              puVar12 = puVar12 + 1;
              puVar9 = puVar9 + uVar3;
              iVar2 = iVar2 + -1;
            }
            puVar5 = (undefined4 *)((long)puVar5 + (long)m.w * m.elemsize * uVar3);
          }
          lVar6 = lVar6 + 1;
          lVar11 = lVar11 + 4;
        }
      }
      Mat::~Mat(&m);
    }
  }
  return local_d8;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                float* outptr = top_blob.channel(q*stride*stride + sh*stride + sw);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i*stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}